

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void inline_nested_lists(pcut_item_t *nested)

{
  pcut_item_t *ppVar1;
  pcut_item_t *ppVar2;
  pcut_item_t *ppVar3;
  
  if (nested->kind == 1) {
    if (nested->nested != (pcut_item_t *)0x0) {
      ppVar3 = pcut_fix_list_get_real_head(nested->nested);
      ppVar1 = nested->next;
      ppVar2 = nested->nested;
      ppVar2->next = ppVar1;
      if (ppVar1 != (pcut_item_t *)0x0) {
        ppVar1->previous = ppVar2;
      }
      nested->next = ppVar3;
      ppVar3->previous = nested;
    }
    nested->kind = 0;
  }
  return;
}

Assistant:

static void inline_nested_lists(pcut_item_t *nested) {
	pcut_item_t *first;

	if (nested->kind != PCUT_KIND_NESTED) {
		return;
	}

	if (nested->nested == NULL) {
		nested->kind = PCUT_KIND_SKIP;
		return;
	}

	first = pcut_fix_list_get_real_head(nested->nested);
	nested->nested->next = nested->next;
	if (nested->next != NULL) {
		nested->next->previous = nested->nested;
	}
	nested->next = first;
	first->previous = nested;

	nested->kind = PCUT_KIND_SKIP;
}